

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void LargeIntRegMultiply<unsigned_int,_unsigned_long>::
     RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint32_t a,uint64_t *b,uint32_t *pRet)

{
  ulong uVar1;
  
  if ((a == 0 || *b >> 0x20 == 0) && (uVar1 = *b * (ulong)a, uVar1 >> 0x20 == 0)) {
    *pRet = (uint32_t)uVar1;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void RegMultiplyThrow( std::uint32_t a, const std::uint64_t& b, std::uint32_t* pRet ) SAFEINT_CPP_THROW
    {
        if( (std::uint32_t)(b >> 32) != 0 && a != 0 )
            E::SafeIntOnOverflow();

        std::uint64_t tmp = b * (std::uint64_t)a;

        if( (std::uint32_t)(tmp >> 32) != 0 ) // overflow
            E::SafeIntOnOverflow();

        *pRet = (std::uint32_t)tmp;
    }